

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O3

void __thiscall
ASDCP::MXF::ASDCP_MCAConfigParser::ASDCP_MCAConfigParser(ASDCP_MCAConfigParser *this,Dictionary *d)

{
  mca_label_map_t *this_00;
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  MDDEntry *pMVar4;
  long *local_288;
  long local_280;
  long local_278 [2];
  label_traits local_268;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  local_220;
  undefined4 local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined4 local_1a8;
  undefined4 uStack_1a4;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  undefined4 local_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 local_188;
  undefined4 uStack_184;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  undefined4 local_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined4 local_168;
  undefined4 uStack_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  undefined4 local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined4 local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  undefined4 local_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined4 local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  (this->super_InterchangeObject_list_t).
  super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this;
  (this->super_InterchangeObject_list_t).
  super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this;
  (this->super_InterchangeObject_list_t).
  super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  ._M_impl._M_node._M_size = 0;
  this_00 = &this->m_LabelMap;
  p_Var1 = &(this->m_LabelMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_LabelMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_LabelMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_LabelMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_LabelMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_LabelMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_ChannelCount = 0;
  this->m_Dict = d;
  local_288 = local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"Left","");
  pMVar4 = Dictionary::Type(this->m_Dict,MDD_DCAudioChannel_L);
  local_48 = *(undefined4 *)pMVar4->ul;
  uStack_44 = *(undefined4 *)(pMVar4->ul + 4);
  uStack_40 = *(undefined4 *)(pMVar4->ul + 8);
  uStack_3c = *(undefined4 *)(pMVar4->ul + 0xc);
  paVar2 = &local_268.tag_name.field_2;
  local_268.tag_name._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_268,local_288,local_280 + (long)local_288);
  local_268.requires_prefix = true;
  local_268.ul.super_Identifier<16U>.m_HasValue = true;
  local_268.ul.super_Identifier<16U>.m_Value._4_4_ = uStack_44;
  local_268.ul.super_Identifier<16U>.m_Value._0_4_ = local_48;
  local_268.ul.super_Identifier<16U>.m_Value._12_4_ = uStack_3c;
  local_268.ul.super_Identifier<16U>.m_Value._8_4_ = uStack_40;
  local_268.ul.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_0021d318;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[2],_ASDCP::MXF::label_traits,_true>
            (&local_220,(char (*) [2])0x1ec94f,&local_268);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.second.tag_name._M_dataplus._M_p != &local_220.second.tag_name.field_2) {
    operator_delete(local_220.second.tag_name._M_dataplus._M_p,
                    local_220.second.tag_name.field_2._M_allocated_capacity + 1);
  }
  paVar3 = &local_220.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_220.first._M_dataplus._M_p,
                    local_220.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.tag_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_268.tag_name._M_dataplus._M_p,
                    local_268.tag_name.field_2._M_allocated_capacity + 1);
  }
  if (local_288 != local_278) {
    operator_delete(local_288,local_278[0] + 1);
  }
  local_288 = local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"Right","");
  pMVar4 = Dictionary::Type(this->m_Dict,MDD_DCAudioChannel_R);
  local_58 = *(undefined4 *)pMVar4->ul;
  uStack_54 = *(undefined4 *)(pMVar4->ul + 4);
  uStack_50 = *(undefined4 *)(pMVar4->ul + 8);
  uStack_4c = *(undefined4 *)(pMVar4->ul + 0xc);
  local_268.tag_name._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_268,local_288,local_280 + (long)local_288);
  local_268.requires_prefix = true;
  local_268.ul.super_Identifier<16U>.m_HasValue = true;
  local_268.ul.super_Identifier<16U>.m_Value._4_4_ = uStack_54;
  local_268.ul.super_Identifier<16U>.m_Value._0_4_ = local_58;
  local_268.ul.super_Identifier<16U>.m_Value._12_4_ = uStack_4c;
  local_268.ul.super_Identifier<16U>.m_Value._8_4_ = uStack_50;
  local_268.ul.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_0021d318;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[2],_ASDCP::MXF::label_traits,_true>
            (&local_220,(char (*) [2])0x1ed588,&local_268);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.second.tag_name._M_dataplus._M_p != &local_220.second.tag_name.field_2) {
    operator_delete(local_220.second.tag_name._M_dataplus._M_p,
                    local_220.second.tag_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_220.first._M_dataplus._M_p,
                    local_220.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.tag_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_268.tag_name._M_dataplus._M_p,
                    local_268.tag_name.field_2._M_allocated_capacity + 1);
  }
  if (local_288 != local_278) {
    operator_delete(local_288,local_278[0] + 1);
  }
  local_288 = local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"Center","");
  pMVar4 = Dictionary::Type(this->m_Dict,MDD_DCAudioChannel_C);
  local_68 = *(undefined4 *)pMVar4->ul;
  uStack_64 = *(undefined4 *)(pMVar4->ul + 4);
  uStack_60 = *(undefined4 *)(pMVar4->ul + 8);
  uStack_5c = *(undefined4 *)(pMVar4->ul + 0xc);
  local_268.tag_name._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_268,local_288,local_280 + (long)local_288);
  local_268.requires_prefix = true;
  local_268.ul.super_Identifier<16U>.m_HasValue = true;
  local_268.ul.super_Identifier<16U>.m_Value._4_4_ = uStack_64;
  local_268.ul.super_Identifier<16U>.m_Value._0_4_ = local_68;
  local_268.ul.super_Identifier<16U>.m_Value._12_4_ = uStack_5c;
  local_268.ul.super_Identifier<16U>.m_Value._8_4_ = uStack_60;
  local_268.ul.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_0021d318;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[2],_ASDCP::MXF::label_traits,_true>
            (&local_220,(char (*) [2])0x1ebc7f,&local_268);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.second.tag_name._M_dataplus._M_p != &local_220.second.tag_name.field_2) {
    operator_delete(local_220.second.tag_name._M_dataplus._M_p,
                    local_220.second.tag_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_220.first._M_dataplus._M_p,
                    local_220.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.tag_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_268.tag_name._M_dataplus._M_p,
                    local_268.tag_name.field_2._M_allocated_capacity + 1);
  }
  if (local_288 != local_278) {
    operator_delete(local_288,local_278[0] + 1);
  }
  local_288 = local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"LFE","");
  pMVar4 = Dictionary::Type(this->m_Dict,MDD_DCAudioChannel_LFE);
  local_78 = *(undefined4 *)pMVar4->ul;
  uStack_74 = *(undefined4 *)(pMVar4->ul + 4);
  uStack_70 = *(undefined4 *)(pMVar4->ul + 8);
  uStack_6c = *(undefined4 *)(pMVar4->ul + 0xc);
  local_268.tag_name._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_268,local_288,local_280 + (long)local_288);
  local_268.requires_prefix = true;
  local_268.ul.super_Identifier<16U>.m_HasValue = true;
  local_268.ul.super_Identifier<16U>.m_Value._4_4_ = uStack_74;
  local_268.ul.super_Identifier<16U>.m_Value._0_4_ = local_78;
  local_268.ul.super_Identifier<16U>.m_Value._12_4_ = uStack_6c;
  local_268.ul.super_Identifier<16U>.m_Value._8_4_ = uStack_70;
  local_268.ul.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_0021d318;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[4],_ASDCP::MXF::label_traits,_true>
            (&local_220,(char (*) [4])0x1eb24c,&local_268);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.second.tag_name._M_dataplus._M_p != &local_220.second.tag_name.field_2) {
    operator_delete(local_220.second.tag_name._M_dataplus._M_p,
                    local_220.second.tag_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_220.first._M_dataplus._M_p,
                    local_220.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.tag_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_268.tag_name._M_dataplus._M_p,
                    local_268.tag_name.field_2._M_allocated_capacity + 1);
  }
  if (local_288 != local_278) {
    operator_delete(local_288,local_278[0] + 1);
  }
  local_288 = local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"Left Surround","");
  pMVar4 = Dictionary::Type(this->m_Dict,MDD_DCAudioChannel_Ls);
  local_88 = *(undefined4 *)pMVar4->ul;
  uStack_84 = *(undefined4 *)(pMVar4->ul + 4);
  uStack_80 = *(undefined4 *)(pMVar4->ul + 8);
  uStack_7c = *(undefined4 *)(pMVar4->ul + 0xc);
  local_268.tag_name._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_268,local_288,local_280 + (long)local_288);
  local_268.requires_prefix = true;
  local_268.ul.super_Identifier<16U>.m_HasValue = true;
  local_268.ul.super_Identifier<16U>.m_Value._4_4_ = uStack_84;
  local_268.ul.super_Identifier<16U>.m_Value._0_4_ = local_88;
  local_268.ul.super_Identifier<16U>.m_Value._12_4_ = uStack_7c;
  local_268.ul.super_Identifier<16U>.m_Value._8_4_ = uStack_80;
  local_268.ul.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_0021d318;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_220,(char (*) [3])0x1eb25f,&local_268);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.second.tag_name._M_dataplus._M_p != &local_220.second.tag_name.field_2) {
    operator_delete(local_220.second.tag_name._M_dataplus._M_p,
                    local_220.second.tag_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_220.first._M_dataplus._M_p,
                    local_220.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.tag_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_268.tag_name._M_dataplus._M_p,
                    local_268.tag_name.field_2._M_allocated_capacity + 1);
  }
  if (local_288 != local_278) {
    operator_delete(local_288,local_278[0] + 1);
  }
  local_288 = local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"Right Surround","");
  pMVar4 = Dictionary::Type(this->m_Dict,MDD_DCAudioChannel_Rs);
  local_98 = *(undefined4 *)pMVar4->ul;
  uStack_94 = *(undefined4 *)(pMVar4->ul + 4);
  uStack_90 = *(undefined4 *)(pMVar4->ul + 8);
  uStack_8c = *(undefined4 *)(pMVar4->ul + 0xc);
  local_268.tag_name._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_268,local_288,local_280 + (long)local_288);
  local_268.requires_prefix = true;
  local_268.ul.super_Identifier<16U>.m_HasValue = true;
  local_268.ul.super_Identifier<16U>.m_Value._4_4_ = uStack_94;
  local_268.ul.super_Identifier<16U>.m_Value._0_4_ = local_98;
  local_268.ul.super_Identifier<16U>.m_Value._12_4_ = uStack_8c;
  local_268.ul.super_Identifier<16U>.m_Value._8_4_ = uStack_90;
  local_268.ul.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_0021d318;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_220,(char (*) [3])0x1eb271,&local_268);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.second.tag_name._M_dataplus._M_p != &local_220.second.tag_name.field_2) {
    operator_delete(local_220.second.tag_name._M_dataplus._M_p,
                    local_220.second.tag_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_220.first._M_dataplus._M_p,
                    local_220.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.tag_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_268.tag_name._M_dataplus._M_p,
                    local_268.tag_name.field_2._M_allocated_capacity + 1);
  }
  if (local_288 != local_278) {
    operator_delete(local_288,local_278[0] + 1);
  }
  local_288 = local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"Left Side Surround","");
  pMVar4 = Dictionary::Type(this->m_Dict,MDD_DCAudioChannel_Lss);
  local_a8 = *(undefined4 *)pMVar4->ul;
  uStack_a4 = *(undefined4 *)(pMVar4->ul + 4);
  uStack_a0 = *(undefined4 *)(pMVar4->ul + 8);
  uStack_9c = *(undefined4 *)(pMVar4->ul + 0xc);
  local_268.tag_name._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_268,local_288,local_280 + (long)local_288);
  local_268.requires_prefix = true;
  local_268.ul.super_Identifier<16U>.m_HasValue = true;
  local_268.ul.super_Identifier<16U>.m_Value._4_4_ = uStack_a4;
  local_268.ul.super_Identifier<16U>.m_Value._0_4_ = local_a8;
  local_268.ul.super_Identifier<16U>.m_Value._12_4_ = uStack_9c;
  local_268.ul.super_Identifier<16U>.m_Value._8_4_ = uStack_a0;
  local_268.ul.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_0021d318;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[4],_ASDCP::MXF::label_traits,_true>
            (&local_220,(char (*) [4])0x1eb283,&local_268);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.second.tag_name._M_dataplus._M_p != &local_220.second.tag_name.field_2) {
    operator_delete(local_220.second.tag_name._M_dataplus._M_p,
                    local_220.second.tag_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_220.first._M_dataplus._M_p,
                    local_220.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.tag_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_268.tag_name._M_dataplus._M_p,
                    local_268.tag_name.field_2._M_allocated_capacity + 1);
  }
  if (local_288 != local_278) {
    operator_delete(local_288,local_278[0] + 1);
  }
  local_288 = local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"Right Side Surround","");
  pMVar4 = Dictionary::Type(this->m_Dict,MDD_DCAudioChannel_Rss);
  local_b8 = *(undefined4 *)pMVar4->ul;
  uStack_b4 = *(undefined4 *)(pMVar4->ul + 4);
  uStack_b0 = *(undefined4 *)(pMVar4->ul + 8);
  uStack_ac = *(undefined4 *)(pMVar4->ul + 0xc);
  local_268.tag_name._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_268,local_288,local_280 + (long)local_288);
  local_268.requires_prefix = true;
  local_268.ul.super_Identifier<16U>.m_HasValue = true;
  local_268.ul.super_Identifier<16U>.m_Value._4_4_ = uStack_b4;
  local_268.ul.super_Identifier<16U>.m_Value._0_4_ = local_b8;
  local_268.ul.super_Identifier<16U>.m_Value._12_4_ = uStack_ac;
  local_268.ul.super_Identifier<16U>.m_Value._8_4_ = uStack_b0;
  local_268.ul.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_0021d318;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[4],_ASDCP::MXF::label_traits,_true>
            (&local_220,(char (*) [4])0x1eb296,&local_268);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.second.tag_name._M_dataplus._M_p != &local_220.second.tag_name.field_2) {
    operator_delete(local_220.second.tag_name._M_dataplus._M_p,
                    local_220.second.tag_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_220.first._M_dataplus._M_p,
                    local_220.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.tag_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_268.tag_name._M_dataplus._M_p,
                    local_268.tag_name.field_2._M_allocated_capacity + 1);
  }
  if (local_288 != local_278) {
    operator_delete(local_288,local_278[0] + 1);
  }
  local_288 = local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"Left Rear Surround","");
  pMVar4 = Dictionary::Type(this->m_Dict,MDD_DCAudioChannel_Lrs);
  local_c8 = *(undefined4 *)pMVar4->ul;
  uStack_c4 = *(undefined4 *)(pMVar4->ul + 4);
  uStack_c0 = *(undefined4 *)(pMVar4->ul + 8);
  uStack_bc = *(undefined4 *)(pMVar4->ul + 0xc);
  local_268.tag_name._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_268,local_288,local_280 + (long)local_288);
  local_268.requires_prefix = true;
  local_268.ul.super_Identifier<16U>.m_HasValue = true;
  local_268.ul.super_Identifier<16U>.m_Value._4_4_ = uStack_c4;
  local_268.ul.super_Identifier<16U>.m_Value._0_4_ = local_c8;
  local_268.ul.super_Identifier<16U>.m_Value._12_4_ = uStack_bc;
  local_268.ul.super_Identifier<16U>.m_Value._8_4_ = uStack_c0;
  local_268.ul.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_0021d318;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[4],_ASDCP::MXF::label_traits,_true>
            (&local_220,(char (*) [4])0x1eb2a9,&local_268);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.second.tag_name._M_dataplus._M_p != &local_220.second.tag_name.field_2) {
    operator_delete(local_220.second.tag_name._M_dataplus._M_p,
                    local_220.second.tag_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_220.first._M_dataplus._M_p,
                    local_220.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.tag_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_268.tag_name._M_dataplus._M_p,
                    local_268.tag_name.field_2._M_allocated_capacity + 1);
  }
  if (local_288 != local_278) {
    operator_delete(local_288,local_278[0] + 1);
  }
  local_288 = local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"Right Rear Surround","");
  pMVar4 = Dictionary::Type(this->m_Dict,MDD_DCAudioChannel_Rrs);
  local_d8 = *(undefined4 *)pMVar4->ul;
  uStack_d4 = *(undefined4 *)(pMVar4->ul + 4);
  uStack_d0 = *(undefined4 *)(pMVar4->ul + 8);
  uStack_cc = *(undefined4 *)(pMVar4->ul + 0xc);
  local_268.tag_name._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_268,local_288,local_280 + (long)local_288);
  local_268.requires_prefix = true;
  local_268.ul.super_Identifier<16U>.m_HasValue = true;
  local_268.ul.super_Identifier<16U>.m_Value._4_4_ = uStack_d4;
  local_268.ul.super_Identifier<16U>.m_Value._0_4_ = local_d8;
  local_268.ul.super_Identifier<16U>.m_Value._12_4_ = uStack_cc;
  local_268.ul.super_Identifier<16U>.m_Value._8_4_ = uStack_d0;
  local_268.ul.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_0021d318;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[4],_ASDCP::MXF::label_traits,_true>
            (&local_220,(char (*) [4])0x1eb2bc,&local_268);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.second.tag_name._M_dataplus._M_p != &local_220.second.tag_name.field_2) {
    operator_delete(local_220.second.tag_name._M_dataplus._M_p,
                    local_220.second.tag_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_220.first._M_dataplus._M_p,
                    local_220.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.tag_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_268.tag_name._M_dataplus._M_p,
                    local_268.tag_name.field_2._M_allocated_capacity + 1);
  }
  if (local_288 != local_278) {
    operator_delete(local_288,local_278[0] + 1);
  }
  local_288 = local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"Left Center","");
  pMVar4 = Dictionary::Type(this->m_Dict,MDD_DCAudioChannel_Lc);
  local_e8 = *(undefined4 *)pMVar4->ul;
  uStack_e4 = *(undefined4 *)(pMVar4->ul + 4);
  uStack_e0 = *(undefined4 *)(pMVar4->ul + 8);
  uStack_dc = *(undefined4 *)(pMVar4->ul + 0xc);
  local_268.tag_name._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_268,local_288,local_280 + (long)local_288);
  local_268.requires_prefix = true;
  local_268.ul.super_Identifier<16U>.m_HasValue = true;
  local_268.ul.super_Identifier<16U>.m_Value._4_4_ = uStack_e4;
  local_268.ul.super_Identifier<16U>.m_Value._0_4_ = local_e8;
  local_268.ul.super_Identifier<16U>.m_Value._12_4_ = uStack_dc;
  local_268.ul.super_Identifier<16U>.m_Value._8_4_ = uStack_e0;
  local_268.ul.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_0021d318;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_220,(char (*) [3])0x1eb2cf,&local_268);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.second.tag_name._M_dataplus._M_p != &local_220.second.tag_name.field_2) {
    operator_delete(local_220.second.tag_name._M_dataplus._M_p,
                    local_220.second.tag_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_220.first._M_dataplus._M_p,
                    local_220.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.tag_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_268.tag_name._M_dataplus._M_p,
                    local_268.tag_name.field_2._M_allocated_capacity + 1);
  }
  if (local_288 != local_278) {
    operator_delete(local_288,local_278[0] + 1);
  }
  local_288 = local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"Right Center","");
  pMVar4 = Dictionary::Type(this->m_Dict,MDD_DCAudioChannel_Rc);
  local_f8 = *(undefined4 *)pMVar4->ul;
  uStack_f4 = *(undefined4 *)(pMVar4->ul + 4);
  uStack_f0 = *(undefined4 *)(pMVar4->ul + 8);
  uStack_ec = *(undefined4 *)(pMVar4->ul + 0xc);
  local_268.tag_name._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_268,local_288,local_280 + (long)local_288);
  local_268.requires_prefix = true;
  local_268.ul.super_Identifier<16U>.m_HasValue = true;
  local_268.ul.super_Identifier<16U>.m_Value._4_4_ = uStack_f4;
  local_268.ul.super_Identifier<16U>.m_Value._0_4_ = local_f8;
  local_268.ul.super_Identifier<16U>.m_Value._12_4_ = uStack_ec;
  local_268.ul.super_Identifier<16U>.m_Value._8_4_ = uStack_f0;
  local_268.ul.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_0021d318;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_220,(char (*) [3])0x1eb2e1,&local_268);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.second.tag_name._M_dataplus._M_p != &local_220.second.tag_name.field_2) {
    operator_delete(local_220.second.tag_name._M_dataplus._M_p,
                    local_220.second.tag_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_220.first._M_dataplus._M_p,
                    local_220.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.tag_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_268.tag_name._M_dataplus._M_p,
                    local_268.tag_name.field_2._M_allocated_capacity + 1);
  }
  if (local_288 != local_278) {
    operator_delete(local_288,local_278[0] + 1);
  }
  local_288 = local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"Center Surround","");
  pMVar4 = Dictionary::Type(this->m_Dict,MDD_DCAudioChannel_Cs);
  local_108 = *(undefined4 *)pMVar4->ul;
  uStack_104 = *(undefined4 *)(pMVar4->ul + 4);
  uStack_100 = *(undefined4 *)(pMVar4->ul + 8);
  uStack_fc = *(undefined4 *)(pMVar4->ul + 0xc);
  local_268.tag_name._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_268,local_288,local_280 + (long)local_288);
  local_268.requires_prefix = true;
  local_268.ul.super_Identifier<16U>.m_HasValue = true;
  local_268.ul.super_Identifier<16U>.m_Value._4_4_ = uStack_104;
  local_268.ul.super_Identifier<16U>.m_Value._0_4_ = local_108;
  local_268.ul.super_Identifier<16U>.m_Value._12_4_ = uStack_fc;
  local_268.ul.super_Identifier<16U>.m_Value._8_4_ = uStack_100;
  local_268.ul.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_0021d318;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_220,(char (*) [3])0x1eb2f3,&local_268);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.second.tag_name._M_dataplus._M_p != &local_220.second.tag_name.field_2) {
    operator_delete(local_220.second.tag_name._M_dataplus._M_p,
                    local_220.second.tag_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_220.first._M_dataplus._M_p,
                    local_220.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.tag_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_268.tag_name._M_dataplus._M_p,
                    local_268.tag_name.field_2._M_allocated_capacity + 1);
  }
  if (local_288 != local_278) {
    operator_delete(local_288,local_278[0] + 1);
  }
  local_288 = local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"Hearing Impaired","");
  pMVar4 = Dictionary::Type(this->m_Dict,MDD_DCAudioChannel_HI);
  local_118 = *(undefined4 *)pMVar4->ul;
  uStack_114 = *(undefined4 *)(pMVar4->ul + 4);
  uStack_110 = *(undefined4 *)(pMVar4->ul + 8);
  uStack_10c = *(undefined4 *)(pMVar4->ul + 0xc);
  local_268.tag_name._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_268,local_288,local_280 + (long)local_288);
  local_268.requires_prefix = true;
  local_268.ul.super_Identifier<16U>.m_HasValue = true;
  local_268.ul.super_Identifier<16U>.m_Value._4_4_ = uStack_114;
  local_268.ul.super_Identifier<16U>.m_Value._0_4_ = local_118;
  local_268.ul.super_Identifier<16U>.m_Value._12_4_ = uStack_10c;
  local_268.ul.super_Identifier<16U>.m_Value._8_4_ = uStack_110;
  local_268.ul.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_0021d318;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_220,(char (*) [3])0x1eb53d,&local_268);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.second.tag_name._M_dataplus._M_p != &local_220.second.tag_name.field_2) {
    operator_delete(local_220.second.tag_name._M_dataplus._M_p,
                    local_220.second.tag_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_220.first._M_dataplus._M_p,
                    local_220.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.tag_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_268.tag_name._M_dataplus._M_p,
                    local_268.tag_name.field_2._M_allocated_capacity + 1);
  }
  if (local_288 != local_278) {
    operator_delete(local_288,local_278[0] + 1);
  }
  local_288 = local_278;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_288,"Visually Impaired-Narrative","");
  pMVar4 = Dictionary::Type(this->m_Dict,MDD_DCAudioChannel_VIN);
  local_128 = *(undefined4 *)pMVar4->ul;
  uStack_124 = *(undefined4 *)(pMVar4->ul + 4);
  uStack_120 = *(undefined4 *)(pMVar4->ul + 8);
  uStack_11c = *(undefined4 *)(pMVar4->ul + 0xc);
  local_268.tag_name._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_268,local_288,local_280 + (long)local_288);
  local_268.requires_prefix = true;
  local_268.ul.super_Identifier<16U>.m_HasValue = true;
  local_268.ul.super_Identifier<16U>.m_Value._4_4_ = uStack_124;
  local_268.ul.super_Identifier<16U>.m_Value._0_4_ = local_128;
  local_268.ul.super_Identifier<16U>.m_Value._12_4_ = uStack_11c;
  local_268.ul.super_Identifier<16U>.m_Value._8_4_ = uStack_120;
  local_268.ul.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_0021d318;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[4],_ASDCP::MXF::label_traits,_true>
            (&local_220,(char (*) [4])0x1eb553,&local_268);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.second.tag_name._M_dataplus._M_p != &local_220.second.tag_name.field_2) {
    operator_delete(local_220.second.tag_name._M_dataplus._M_p,
                    local_220.second.tag_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_220.first._M_dataplus._M_p,
                    local_220.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.tag_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_268.tag_name._M_dataplus._M_p,
                    local_268.tag_name.field_2._M_allocated_capacity + 1);
  }
  if (local_288 != local_278) {
    operator_delete(local_288,local_278[0] + 1);
  }
  local_288 = local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"5.1","");
  pMVar4 = Dictionary::Type(this->m_Dict,MDD_DCAudioSoundfield_51);
  local_138 = *(undefined4 *)pMVar4->ul;
  uStack_134 = *(undefined4 *)(pMVar4->ul + 4);
  uStack_130 = *(undefined4 *)(pMVar4->ul + 8);
  uStack_12c = *(undefined4 *)(pMVar4->ul + 0xc);
  local_268.tag_name._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_268,local_288,local_280 + (long)local_288);
  local_268.requires_prefix = true;
  local_268.ul.super_Identifier<16U>.m_HasValue = true;
  local_268.ul.super_Identifier<16U>.m_Value._4_4_ = uStack_134;
  local_268.ul.super_Identifier<16U>.m_Value._0_4_ = local_138;
  local_268.ul.super_Identifier<16U>.m_Value._12_4_ = uStack_12c;
  local_268.ul.super_Identifier<16U>.m_Value._8_4_ = uStack_130;
  local_268.ul.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_0021d318;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_220,(char (*) [3])0x1eb32d,&local_268);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.second.tag_name._M_dataplus._M_p != &local_220.second.tag_name.field_2) {
    operator_delete(local_220.second.tag_name._M_dataplus._M_p,
                    local_220.second.tag_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_220.first._M_dataplus._M_p,
                    local_220.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.tag_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_268.tag_name._M_dataplus._M_p,
                    local_268.tag_name.field_2._M_allocated_capacity + 1);
  }
  if (local_288 != local_278) {
    operator_delete(local_288,local_278[0] + 1);
  }
  local_288 = local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"7.1DS","");
  pMVar4 = Dictionary::Type(this->m_Dict,MDD_DCAudioSoundfield_71);
  local_148 = *(undefined4 *)pMVar4->ul;
  uStack_144 = *(undefined4 *)(pMVar4->ul + 4);
  uStack_140 = *(undefined4 *)(pMVar4->ul + 8);
  uStack_13c = *(undefined4 *)(pMVar4->ul + 0xc);
  local_268.tag_name._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_268,local_288,local_280 + (long)local_288);
  local_268.requires_prefix = true;
  local_268.ul.super_Identifier<16U>.m_HasValue = true;
  local_268.ul.super_Identifier<16U>.m_Value._4_4_ = uStack_144;
  local_268.ul.super_Identifier<16U>.m_Value._0_4_ = local_148;
  local_268.ul.super_Identifier<16U>.m_Value._12_4_ = uStack_13c;
  local_268.ul.super_Identifier<16U>.m_Value._8_4_ = uStack_140;
  local_268.ul.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_0021d318;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_220,(char (*) [3])0x1eb342,&local_268);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.second.tag_name._M_dataplus._M_p != &local_220.second.tag_name.field_2) {
    operator_delete(local_220.second.tag_name._M_dataplus._M_p,
                    local_220.second.tag_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_220.first._M_dataplus._M_p,
                    local_220.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.tag_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_268.tag_name._M_dataplus._M_p,
                    local_268.tag_name.field_2._M_allocated_capacity + 1);
  }
  if (local_288 != local_278) {
    operator_delete(local_288,local_278[0] + 1);
  }
  local_288 = local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"7.1SDS","");
  pMVar4 = Dictionary::Type(this->m_Dict,MDD_DCAudioSoundfield_SDS);
  local_158 = *(undefined4 *)pMVar4->ul;
  uStack_154 = *(undefined4 *)(pMVar4->ul + 4);
  uStack_150 = *(undefined4 *)(pMVar4->ul + 8);
  uStack_14c = *(undefined4 *)(pMVar4->ul + 0xc);
  local_268.tag_name._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_268,local_288,local_280 + (long)local_288);
  local_268.requires_prefix = true;
  local_268.ul.super_Identifier<16U>.m_HasValue = true;
  local_268.ul.super_Identifier<16U>.m_Value._4_4_ = uStack_154;
  local_268.ul.super_Identifier<16U>.m_Value._0_4_ = local_158;
  local_268.ul.super_Identifier<16U>.m_Value._12_4_ = uStack_14c;
  local_268.ul.super_Identifier<16U>.m_Value._8_4_ = uStack_150;
  local_268.ul.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_0021d318;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[4],_ASDCP::MXF::label_traits,_true>
            (&local_220,(char (*) [4])0x1ef235,&local_268);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.second.tag_name._M_dataplus._M_p != &local_220.second.tag_name.field_2) {
    operator_delete(local_220.second.tag_name._M_dataplus._M_p,
                    local_220.second.tag_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_220.first._M_dataplus._M_p,
                    local_220.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.tag_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_268.tag_name._M_dataplus._M_p,
                    local_268.tag_name.field_2._M_allocated_capacity + 1);
  }
  if (local_288 != local_278) {
    operator_delete(local_288,local_278[0] + 1);
  }
  local_288 = local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"6.1","");
  pMVar4 = Dictionary::Type(this->m_Dict,MDD_DCAudioSoundfield_61);
  local_168 = *(undefined4 *)pMVar4->ul;
  uStack_164 = *(undefined4 *)(pMVar4->ul + 4);
  uStack_160 = *(undefined4 *)(pMVar4->ul + 8);
  uStack_15c = *(undefined4 *)(pMVar4->ul + 0xc);
  local_268.tag_name._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_268,local_288,local_280 + (long)local_288);
  local_268.requires_prefix = true;
  local_268.ul.super_Identifier<16U>.m_HasValue = true;
  local_268.ul.super_Identifier<16U>.m_Value._4_4_ = uStack_164;
  local_268.ul.super_Identifier<16U>.m_Value._0_4_ = local_168;
  local_268.ul.super_Identifier<16U>.m_Value._12_4_ = uStack_15c;
  local_268.ul.super_Identifier<16U>.m_Value._8_4_ = uStack_160;
  local_268.ul.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_0021d318;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_220,(char (*) [3])0x1ed51b,&local_268);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.second.tag_name._M_dataplus._M_p != &local_220.second.tag_name.field_2) {
    operator_delete(local_220.second.tag_name._M_dataplus._M_p,
                    local_220.second.tag_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_220.first._M_dataplus._M_p,
                    local_220.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.tag_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_268.tag_name._M_dataplus._M_p,
                    local_268.tag_name.field_2._M_allocated_capacity + 1);
  }
  if (local_288 != local_278) {
    operator_delete(local_288,local_278[0] + 1);
  }
  local_288 = local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"1.0 Monaural","");
  pMVar4 = Dictionary::Type(this->m_Dict,MDD_DCAudioSoundfield_M);
  local_178 = *(undefined4 *)pMVar4->ul;
  uStack_174 = *(undefined4 *)(pMVar4->ul + 4);
  uStack_170 = *(undefined4 *)(pMVar4->ul + 8);
  uStack_16c = *(undefined4 *)(pMVar4->ul + 0xc);
  local_268.tag_name._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_268,local_288,local_280 + (long)local_288);
  local_268.requires_prefix = true;
  local_268.ul.super_Identifier<16U>.m_HasValue = true;
  local_268.ul.super_Identifier<16U>.m_Value._4_4_ = uStack_174;
  local_268.ul.super_Identifier<16U>.m_Value._0_4_ = local_178;
  local_268.ul.super_Identifier<16U>.m_Value._12_4_ = uStack_16c;
  local_268.ul.super_Identifier<16U>.m_Value._8_4_ = uStack_170;
  local_268.ul.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_0021d318;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[2],_ASDCP::MXF::label_traits,_true>
            (&local_220,(char (*) [2])0x1ed557,&local_268);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.second.tag_name._M_dataplus._M_p != &local_220.second.tag_name.field_2) {
    operator_delete(local_220.second.tag_name._M_dataplus._M_p,
                    local_220.second.tag_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_220.first._M_dataplus._M_p,
                    local_220.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.tag_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_268.tag_name._M_dataplus._M_p,
                    local_268.tag_name.field_2._M_allocated_capacity + 1);
  }
  if (local_288 != local_278) {
    operator_delete(local_288,local_278[0] + 1);
  }
  local_288 = local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"FSK Sync","");
  pMVar4 = Dictionary::Type(this->m_Dict,MDD_DCAudioChannel_FSKSyncSignalChannel);
  local_188 = *(undefined4 *)pMVar4->ul;
  uStack_184 = *(undefined4 *)(pMVar4->ul + 4);
  uStack_180 = *(undefined4 *)(pMVar4->ul + 8);
  uStack_17c = *(undefined4 *)(pMVar4->ul + 0xc);
  local_268.tag_name._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_268,local_288,local_280 + (long)local_288);
  local_268.requires_prefix = true;
  local_268.ul.super_Identifier<16U>.m_HasValue = true;
  local_268.ul.super_Identifier<16U>.m_Value._4_4_ = uStack_184;
  local_268.ul.super_Identifier<16U>.m_Value._0_4_ = local_188;
  local_268.ul.super_Identifier<16U>.m_Value._12_4_ = uStack_17c;
  local_268.ul.super_Identifier<16U>.m_Value._8_4_ = uStack_180;
  local_268.ul.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_0021d318;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[8],_ASDCP::MXF::label_traits,_true>
            (&local_220,(char (*) [8])"FSKSync",&local_268);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.second.tag_name._M_dataplus._M_p != &local_220.second.tag_name.field_2) {
    operator_delete(local_220.second.tag_name._M_dataplus._M_p,
                    local_220.second.tag_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_220.first._M_dataplus._M_p,
                    local_220.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.tag_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_268.tag_name._M_dataplus._M_p,
                    local_268.tag_name.field_2._M_allocated_capacity + 1);
  }
  if (local_288 != local_278) {
    operator_delete(local_288,local_278[0] + 1);
  }
  local_288 = local_278;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_288,"D-BOX Motion Code Primary Stream","");
  pMVar4 = Dictionary::Type(this->m_Dict,MDD_DBOXMotionCodePrimaryStream);
  local_198 = *(undefined4 *)pMVar4->ul;
  uStack_194 = *(undefined4 *)(pMVar4->ul + 4);
  uStack_190 = *(undefined4 *)(pMVar4->ul + 8);
  uStack_18c = *(undefined4 *)(pMVar4->ul + 0xc);
  local_268.tag_name._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_268,local_288,local_280 + (long)local_288);
  local_268.requires_prefix = false;
  local_268.ul.super_Identifier<16U>.m_HasValue = true;
  local_268.ul.super_Identifier<16U>.m_Value._4_4_ = uStack_194;
  local_268.ul.super_Identifier<16U>.m_Value._0_4_ = local_198;
  local_268.ul.super_Identifier<16U>.m_Value._12_4_ = uStack_18c;
  local_268.ul.super_Identifier<16U>.m_Value._8_4_ = uStack_190;
  local_268.ul.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_0021d318;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[5],_ASDCP::MXF::label_traits,_true>
            (&local_220,(char (*) [5])"DBOX",&local_268);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.second.tag_name._M_dataplus._M_p != &local_220.second.tag_name.field_2) {
    operator_delete(local_220.second.tag_name._M_dataplus._M_p,
                    local_220.second.tag_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_220.first._M_dataplus._M_p,
                    local_220.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.tag_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_268.tag_name._M_dataplus._M_p,
                    local_268.tag_name.field_2._M_allocated_capacity + 1);
  }
  if (local_288 != local_278) {
    operator_delete(local_288,local_278[0] + 1);
  }
  local_288 = local_278;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_288,"D-BOX Motion Code Secondary Stream","");
  pMVar4 = Dictionary::Type(this->m_Dict,MDD_DBOXMotionCodeSecondaryStream);
  local_1a8 = *(undefined4 *)pMVar4->ul;
  uStack_1a4 = *(undefined4 *)(pMVar4->ul + 4);
  uStack_1a0 = *(undefined4 *)(pMVar4->ul + 8);
  uStack_19c = *(undefined4 *)(pMVar4->ul + 0xc);
  local_268.tag_name._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_268,local_288,local_280 + (long)local_288);
  local_268.requires_prefix = false;
  local_268.ul.super_Identifier<16U>.m_HasValue = true;
  local_268.ul.super_Identifier<16U>.m_Value._4_4_ = uStack_1a4;
  local_268.ul.super_Identifier<16U>.m_Value._0_4_ = local_1a8;
  local_268.ul.super_Identifier<16U>.m_Value._12_4_ = uStack_19c;
  local_268.ul.super_Identifier<16U>.m_Value._8_4_ = uStack_1a0;
  local_268.ul.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_0021d318;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[6],_ASDCP::MXF::label_traits,_true>
            (&local_220,(char (*) [6])"DBOX2",&local_268);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.second.tag_name._M_dataplus._M_p != &local_220.second.tag_name.field_2) {
    operator_delete(local_220.second.tag_name._M_dataplus._M_p,
                    local_220.second.tag_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_220.first._M_dataplus._M_p,
                    local_220.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.tag_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_268.tag_name._M_dataplus._M_p,
                    local_268.tag_name.field_2._M_allocated_capacity + 1);
  }
  if (local_288 != local_278) {
    operator_delete(local_288,local_278[0] + 1);
  }
  local_288 = local_278;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_288,"Sign Language Video Stream","");
  pMVar4 = Dictionary::Type(this->m_Dict,MDD_AudioChannelSLVS);
  local_1b8 = *(undefined4 *)pMVar4->ul;
  uStack_1b4 = *(undefined4 *)(pMVar4->ul + 4);
  uStack_1b0 = *(undefined4 *)(pMVar4->ul + 8);
  uStack_1ac = *(undefined4 *)(pMVar4->ul + 0xc);
  local_268.tag_name._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_268,local_288,local_280 + (long)local_288);
  local_268.requires_prefix = false;
  local_268.ul.super_Identifier<16U>.m_HasValue = true;
  local_268.ul.super_Identifier<16U>.m_Value._4_4_ = uStack_1b4;
  local_268.ul.super_Identifier<16U>.m_Value._0_4_ = local_1b8;
  local_268.ul.super_Identifier<16U>.m_Value._12_4_ = uStack_1ac;
  local_268.ul.super_Identifier<16U>.m_Value._8_4_ = uStack_1b0;
  local_268.ul.super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_0021d318;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[5],_ASDCP::MXF::label_traits,_true>
            (&local_220,(char (*) [5])0x1ed187,&local_268);
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>,std::_Select1st<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>,ASDCP::MXF::ci_comp,std::allocator<std::pair<std::__cxx11::string_const,ASDCP::MXF::label_traits_const>>>
              *)this_00,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.second.tag_name._M_dataplus._M_p != &local_220.second.tag_name.field_2) {
    operator_delete(local_220.second.tag_name._M_dataplus._M_p,
                    local_220.second.tag_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_220.first._M_dataplus._M_p,
                    local_220.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.tag_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_268.tag_name._M_dataplus._M_p,
                    local_268.tag_name.field_2._M_allocated_capacity + 1);
  }
  if (local_288 != local_278) {
    operator_delete(local_288,local_278[0] + 1);
  }
  return;
}

Assistant:

ASDCP::MXF::ASDCP_MCAConfigParser::ASDCP_MCAConfigParser(const Dictionary* d) : m_Dict(d), m_ChannelCount(0)
{
  typedef mca_label_map_t::value_type pair;
  m_LabelMap.insert(pair("L",     label_traits("Left"                              , true,  m_Dict->ul(MDD_DCAudioChannel_L))));
  m_LabelMap.insert(pair("R",     label_traits("Right"                             , true,  m_Dict->ul(MDD_DCAudioChannel_R))));
  m_LabelMap.insert(pair("C",     label_traits("Center"                            , true,  m_Dict->ul(MDD_DCAudioChannel_C))));
  m_LabelMap.insert(pair("LFE",   label_traits("LFE"                               , true,  m_Dict->ul(MDD_DCAudioChannel_LFE))));
  m_LabelMap.insert(pair("Ls",    label_traits("Left Surround"                     , true,  m_Dict->ul(MDD_DCAudioChannel_Ls))));
  m_LabelMap.insert(pair("Rs",    label_traits("Right Surround"                    , true,  m_Dict->ul(MDD_DCAudioChannel_Rs))));
  m_LabelMap.insert(pair("Lss",   label_traits("Left Side Surround"                , true,  m_Dict->ul(MDD_DCAudioChannel_Lss))));
  m_LabelMap.insert(pair("Rss",   label_traits("Right Side Surround"               , true,  m_Dict->ul(MDD_DCAudioChannel_Rss))));
  m_LabelMap.insert(pair("Lrs",   label_traits("Left Rear Surround"                , true,  m_Dict->ul(MDD_DCAudioChannel_Lrs))));
  m_LabelMap.insert(pair("Rrs",   label_traits("Right Rear Surround"               , true,  m_Dict->ul(MDD_DCAudioChannel_Rrs))));
  m_LabelMap.insert(pair("Lc",    label_traits("Left Center"                       , true,  m_Dict->ul(MDD_DCAudioChannel_Lc))));
  m_LabelMap.insert(pair("Rc",    label_traits("Right Center"                      , true,  m_Dict->ul(MDD_DCAudioChannel_Rc))));
  m_LabelMap.insert(pair("Cs",    label_traits("Center Surround"                   , true,  m_Dict->ul(MDD_DCAudioChannel_Cs))));
  m_LabelMap.insert(pair("HI",    label_traits("Hearing Impaired"                  , true,  m_Dict->ul(MDD_DCAudioChannel_HI))));
  m_LabelMap.insert(pair("VIN",   label_traits("Visually Impaired-Narrative"       , true,  m_Dict->ul(MDD_DCAudioChannel_VIN))));
  m_LabelMap.insert(pair("51",    label_traits("5.1"                               , true,  m_Dict->ul(MDD_DCAudioSoundfield_51))));
  m_LabelMap.insert(pair("71",    label_traits("7.1DS"                             , true,  m_Dict->ul(MDD_DCAudioSoundfield_71))));
  m_LabelMap.insert(pair("SDS",   label_traits("7.1SDS"                            , true,  m_Dict->ul(MDD_DCAudioSoundfield_SDS))));
  m_LabelMap.insert(pair("61",    label_traits("6.1"                               , true,  m_Dict->ul(MDD_DCAudioSoundfield_61))));
  m_LabelMap.insert(pair("M",     label_traits("1.0 Monaural"                      , true,  m_Dict->ul(MDD_DCAudioSoundfield_M))));
  m_LabelMap.insert(pair("FSKSync",   label_traits("FSK Sync"                      , true,  m_Dict->ul(MDD_DCAudioChannel_FSKSyncSignalChannel))));
  m_LabelMap.insert(pair("DBOX",  label_traits("D-BOX Motion Code Primary Stream"  , false, m_Dict->ul(MDD_DBOXMotionCodePrimaryStream))));
  m_LabelMap.insert(pair("DBOX2", label_traits("D-BOX Motion Code Secondary Stream", false, m_Dict->ul(MDD_DBOXMotionCodeSecondaryStream))));
  m_LabelMap.insert(pair("SLVS",  label_traits("Sign Language Video Stream"        , false, m_Dict->ul(MDD_AudioChannelSLVS))));
}